

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  ostream *poVar8;
  ssize_t sVar9;
  size_t __nbytes;
  long lVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_25;
  allocator_type local_db3;
  allocator_type local_db2;
  allocator local_db1;
  allocator local_db0;
  allocator_type local_daf;
  allocator local_dae;
  allocator local_dad;
  allocator_type local_dac;
  allocator local_dab;
  allocator local_daa;
  allocator_type local_da9;
  allocator local_da8;
  allocator local_da7;
  allocator_type local_da6;
  allocator local_da5;
  allocator local_da4;
  allocator local_da3;
  allocator local_da2;
  allocator_type local_da1;
  allocator local_da0;
  allocator local_d9f;
  allocator local_d9e;
  allocator local_d9d;
  allocator_type local_d9c;
  allocator local_d9b;
  allocator local_d9a;
  allocator local_d99;
  allocator local_d98;
  allocator_type local_d97;
  allocator local_d96;
  allocator local_d95;
  allocator local_d94;
  allocator local_d93;
  allocator_type local_d92;
  allocator local_d91;
  allocator local_d90;
  allocator local_d8f;
  allocator local_d8e;
  allocator_type local_d8d;
  allocator local_d8c;
  allocator local_d8b;
  allocator local_d8a;
  allocator_type local_d89;
  allocator local_d88;
  allocator local_d87;
  allocator local_d86;
  allocator_type local_d85;
  allocator local_d84;
  allocator local_d83;
  allocator_type local_d82;
  allocator local_d81;
  allocator local_d80;
  allocator_type local_d7f;
  allocator local_d7e;
  allocator local_d7d;
  allocator local_d7c;
  allocator local_d7b;
  allocator_type local_d7a;
  allocator local_d79;
  allocator local_d78;
  allocator local_d77;
  allocator_type local_d76;
  allocator local_d75;
  allocator local_d74;
  allocator local_d73;
  allocator local_d72;
  allocator_type local_d71;
  allocator local_d70;
  allocator local_d6f;
  allocator local_d6e;
  allocator local_d6d;
  allocator_type local_d6c;
  allocator local_d6b;
  allocator local_d6a;
  allocator local_d69;
  allocator local_d68;
  allocator_type local_d67;
  allocator local_d66;
  allocator local_d65;
  allocator_type local_d64;
  allocator local_d63;
  allocator local_d62;
  allocator_type local_d61;
  allocator local_d60;
  allocator local_d5f;
  allocator local_d5e;
  allocator local_d5d;
  allocator_type local_d5c;
  allocator local_d5b;
  allocator local_d5a;
  allocator local_d59;
  allocator_type local_d58;
  allocator local_d57;
  allocator local_d56;
  allocator_type local_d55;
  allocator local_d54;
  allocator local_d53;
  allocator local_d52;
  allocator_type local_d51;
  allocator local_d50;
  allocator local_d4f;
  allocator local_d4e;
  allocator local_d4d;
  allocator_type local_d4c;
  allocator local_d4b;
  allocator local_d4a;
  allocator local_d49;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_d48;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  rules;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ParseTableCalculation table_calculation;
  string filename;
  string local_c40;
  Parser parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ae8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ad0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ab8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_aa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  string local_990 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  string local_950 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  string local_910 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  string local_8d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  string local_890 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  string local_850 [32];
  string read_string;
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  string local_790 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  string local_750 [32];
  Tokenizer tokenizer;
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  string local_690 [32];
  vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
  table;
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string line;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string token;
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0 [32];
  string local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270 [32];
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210 [32];
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [32];
  string local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&local_c40,"filename",(allocator *)&parser);
  parseArguments(&args,&local_c40,argc,argv);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::string((string *)&parser,"help",(allocator *)&table_calculation);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&args._M_h,(key_type *)&parser);
  std::__cxx11::string::~string((string *)&parser);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::string((string *)&parser,"filename",(allocator *)&table_calculation);
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&args._M_h,(key_type *)&parser);
    std::__cxx11::string::~string((string *)&parser);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::string
                ((string *)&parser,"No file provided",(allocator *)&table_calculation);
      printError((string *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      printHelp();
      iVar2 = -1;
    }
    else {
      std::__cxx11::string::string
                ((string *)&parser,"tokenizer_debug",(allocator *)&table_calculation);
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&args._M_h,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&parser,"table_debug",(allocator *)&table_calculation);
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&args._M_h,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&parser,"parser_debug",(allocator *)&table_calculation)
      ;
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&args._M_h,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&parser,"debug",(allocator *)&table_calculation);
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&args._M_h,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string((string *)&parser,"ast",(allocator *)&table_calculation);
      local_d48._M_cur =
           (__node_type *)
           std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&args._M_h,(key_type *)&parser);
      std::__cxx11::string::~string((string *)&parser);
      std::__cxx11::string::string
                ((string *)&filename,
                 (string *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28));
      std::__cxx11::string::string((string *)&local_110,"program",&local_d49);
      std::__cxx11::string::string(local_f0,"commands",&local_d4a);
      std::__cxx11::string::string(local_d0,"EOF",&local_d4b);
      __l._M_len = 3;
      __l._M_array = &local_110;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parser,__l,&local_d4c);
      std::__cxx11::string::string((string *)&table_calculation,"commands",&local_d4d);
      std::__cxx11::string::string
                ((string *)&table_calculation.non_terminal_to_rule_indices_,"command",&local_d4e);
      std::__cxx11::string::string
                ((string *)&table_calculation.non_terminal_to_rule_indices_._M_h._M_rehash_policy,
                 "SEMICOLON",&local_d4f);
      std::__cxx11::string::string
                ((string *)&table_calculation.non_terminal_first_sets_._M_h._M_bucket_count,
                 "commands",&local_d50);
      __l_00._M_len = 4;
      __l_00._M_array = (iterator)&table_calculation;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parser.parse_table_.
                   super__Vector_base<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_00,&local_d51);
      std::__cxx11::string::string((string *)&local_170,"commands",&local_d52);
      std::__cxx11::string::string(local_150,"block",&local_d53);
      std::__cxx11::string::string(local_130,"commands",&local_d54);
      __l_01._M_len = 3;
      __l_01._M_array = &local_170;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parser.rules_.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_01,&local_d55);
      std::__cxx11::string::string((string *)&local_6b0,"commands",&local_d56);
      std::__cxx11::string::string(local_690,"",&local_d57);
      __l_02._M_len = 2;
      __l_02._M_array = &local_6b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parser.stack_.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_start,__l_02,&local_d58);
      std::__cxx11::string::string((string *)&local_1d0,"command",&local_d59);
      std::__cxx11::string::string(local_1b0,"PRINT",&local_d5a);
      std::__cxx11::string::string(local_190,"rvalue",&local_d5b);
      __l_03._M_len = 3;
      __l_03._M_array = &local_1d0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&parser.stack_.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start + 0x18),__l_03,&local_d5c);
      std::__cxx11::string::string((string *)&tokenizer,"command",&local_d5d);
      std::__cxx11::string::string(local_710,"VARIABLE",&local_d5e);
      std::__cxx11::string::string(local_6f0,"ASSIGN",&local_d5f);
      std::__cxx11::string::string(local_6d0,"rvalue",&local_d60);
      __l_04._M_len = 4;
      __l_04._M_array = (iterator)&tokenizer;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&parser.stack_.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish + 0x10),__l_04,&local_d61);
      std::__cxx11::string::string((string *)&local_770,"command",&local_d62);
      std::__cxx11::string::string(local_750,"function_call",&local_d63);
      __l_05._M_len = 2;
      __l_05._M_array = &local_770;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parser.tree_nodes_stack_.c.super__Deque_base<ASTNode,_std::allocator<ASTNode>_>.
                   _M_impl.super__Deque_impl_data._M_map_size,__l_05,&local_d64);
      std::__cxx11::string::string((string *)&local_7b0,"command",&local_d65);
      std::__cxx11::string::string(local_790,"return",&local_d66);
      __l_06._M_len = 2;
      __l_06._M_array = &local_7b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&parser.tree_nodes_stack_.c.
                          super__Deque_base<ASTNode,_std::allocator<ASTNode>_>._M_impl.
                          super__Deque_impl_data._M_start + 0x10),__l_06,&local_d67);
      std::__cxx11::string::string((string *)&token,"block",&local_d68);
      std::__cxx11::string::string(local_350,"OPEN_CURLY_BRACKET",&local_d69);
      std::__cxx11::string::string(local_330,"commands",&local_d6a);
      std::__cxx11::string::string(local_310,"CLOSE_CURLY_BRACKET",&local_d6b);
      __l_07._M_len = 4;
      __l_07._M_array = &token;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&parser.tree_nodes_stack_.c.
                          super__Deque_base<ASTNode,_std::allocator<ASTNode>_>._M_impl.
                          super__Deque_impl_data._M_finish + 8),__l_07,&local_d6c);
      std::__cxx11::string::string((string *)&read_string,"function",&local_d6d);
      std::__cxx11::string::string(local_810,"FUNCTION",&local_d6e);
      std::__cxx11::string::string(local_7f0,"parameter_list",&local_d6f);
      std::__cxx11::string::string(local_7d0,"block",&local_d70);
      __l_08._M_len = 4;
      __l_08._M_array = &read_string;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b48,__l_08,&local_d71);
      std::__cxx11::string::string((string *)&line,"parameter_list",&local_d72);
      std::__cxx11::string::string(local_3d0,"OPEN_BRACKET",&local_d73);
      std::__cxx11::string::string(local_3b0,"parameters",&local_d74);
      std::__cxx11::string::string(local_390,"CLOSE_BRACKET",&local_d75);
      __l_09._M_len = 4;
      __l_09._M_array = &line;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b30,__l_09,&local_d76);
      std::__cxx11::string::string((string *)&local_230,"parameter_list",&local_d77);
      std::__cxx11::string::string(local_210,"OPEN_BRACKET",&local_d78);
      std::__cxx11::string::string(local_1f0,"CLOSE_BRACKET",&local_d79);
      __l_10._M_len = 3;
      __l_10._M_array = &local_230;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b18,__l_10,&local_d7a);
      std::__cxx11::string::string((string *)&local_470,"parameters",&local_d7b);
      std::__cxx11::string::string(local_450,"parameter",&local_d7c);
      std::__cxx11::string::string(local_430,"COMMA",&local_d7d);
      std::__cxx11::string::string(local_410,"parameters",&local_d7e);
      __l_11._M_len = 4;
      __l_11._M_array = &local_470;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b00,__l_11,&local_d7f);
      std::__cxx11::string::string((string *)&local_870,"parameters",&local_d80);
      std::__cxx11::string::string(local_850,"parameter",&local_d81);
      __l_12._M_len = 2;
      __l_12._M_array = &local_870;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_ae8,__l_12,&local_d82);
      std::__cxx11::string::string((string *)&local_8b0,"parameter",&local_d83);
      std::__cxx11::string::string(local_890,"VARIABLE",&local_d84);
      __l_13._M_len = 2;
      __l_13._M_array = &local_8b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_ad0,__l_13,&local_d85);
      std::__cxx11::string::string((string *)&local_290,"function_call",&local_d86);
      std::__cxx11::string::string(local_270,"VARIABLE",&local_d87);
      std::__cxx11::string::string(local_250,"parameter_list",&local_d88);
      __l_14._M_len = 3;
      __l_14._M_array = &local_290;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_ab8,__l_14,&local_d89);
      std::__cxx11::string::string((string *)&local_2f0,"return",&local_d8a);
      std::__cxx11::string::string(local_2d0,"RETURN",&local_d8b);
      std::__cxx11::string::string(local_2b0,"rvalue",&local_d8c);
      __l_15._M_len = 3;
      __l_15._M_array = &local_2f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_aa0,__l_15,&local_d8d);
      std::__cxx11::string::string((string *)&local_4f0,"rvalue",&local_d8e);
      std::__cxx11::string::string(local_4d0,"rvalue",&local_d8f);
      std::__cxx11::string::string(local_4b0,"SUB",&local_d90);
      std::__cxx11::string::string(local_490,"rvalue",&local_d91);
      __l_16._M_len = 4;
      __l_16._M_array = &local_4f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a88,__l_16,&local_d92);
      std::__cxx11::string::string((string *)&local_570,"rvalue",&local_d93);
      std::__cxx11::string::string(local_550,"rvalue",&local_d94);
      std::__cxx11::string::string(local_530,"ADD",&local_d95);
      std::__cxx11::string::string(local_510,"rvalue",&local_d96);
      __l_17._M_len = 4;
      __l_17._M_array = &local_570;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a70,__l_17,&local_d97);
      std::__cxx11::string::string((string *)&local_5f0,"rvalue",&local_d98);
      std::__cxx11::string::string(local_5d0,"rvalue",&local_d99);
      std::__cxx11::string::string(local_5b0,"MUL",&local_d9a);
      std::__cxx11::string::string(local_590,"rvalue",&local_d9b);
      __l_18._M_len = 4;
      __l_18._M_array = &local_5f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a58,__l_18,&local_d9c);
      std::__cxx11::string::string((string *)&table,"rvalue",&local_d9d);
      std::__cxx11::string::string(local_650,"rvalue",&local_d9e);
      std::__cxx11::string::string(local_630,"DIV",&local_d9f);
      std::__cxx11::string::string(local_610,"rvalue",&local_da0);
      __l_19._M_len = 4;
      __l_19._M_array = (iterator)&table;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a40,__l_19,&local_da1);
      std::__cxx11::string::string((string *)&local_b0,"rvalue",&local_da2);
      std::__cxx11::string::string(local_90,"OPEN_BRACKET",&local_da3);
      std::__cxx11::string::string(local_70,"rvalue",&local_da4);
      std::__cxx11::string::string(local_50,"CLOSE_BRACKET",&local_da5);
      __l_20._M_len = 4;
      __l_20._M_array = &local_b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a28,__l_20,&local_da6);
      std::__cxx11::string::string((string *)&local_8f0,"rvalue",&local_da7);
      std::__cxx11::string::string(local_8d0,"STRING",&local_da8);
      __l_21._M_len = 2;
      __l_21._M_array = &local_8f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a10,__l_21,&local_da9);
      std::__cxx11::string::string((string *)&local_930,"rvalue",&local_daa);
      std::__cxx11::string::string(local_910,"NUMBER",&local_dab);
      __l_22._M_len = 2;
      __l_22._M_array = &local_930;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_9f8,__l_22,&local_dac);
      std::__cxx11::string::string((string *)&local_970,"rvalue",&local_dad);
      std::__cxx11::string::string(local_950,"VARIABLE",&local_dae);
      __l_23._M_len = 2;
      __l_23._M_array = &local_970;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_9e0,__l_23,&local_daf);
      std::__cxx11::string::string((string *)&local_9b0,"rvalue",&local_db0);
      std::__cxx11::string::string(local_990,"function",&local_db1);
      __l_24._M_len = 2;
      __l_24._M_array = &local_9b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_9c8,__l_24,&local_db2);
      __l_25._M_len = 0x1a;
      __l_25._M_array = (iterator)&parser;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector(&rules,__l_25,&local_db3);
      lVar10 = 600;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(&parser.print_debug_ + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_9b0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_970._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_930._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_8f0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&table.
                           super__Vector_base<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&local_5f0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&local_570._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&local_4f0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_2f0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_290._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_8b0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_870._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&local_470._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_230._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string(local_3d0 + lVar10 + -0x20);
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string(local_810 + lVar10 + -0x20);
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string(local_350 + lVar10 + -0x20);
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_7b0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_770._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string(local_710 + lVar10 + -0x20);
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1d0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_6b0._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_170._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string((string *)(&table_calculation.print_debug_ + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_110._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      ParseTableCalculation::ParseTableCalculation
                (&table_calculation,&rules,
                 iVar5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0 ||
                 iVar7.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0);
      ParseTableCalculation::calculateTable(&table,&table_calculation);
      Parser::Parser(&parser,&rules,&table,
                     iVar6.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur != (__node_type *)0x0 ||
                     iVar7.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                     ._M_cur != (__node_type *)0x0);
      Tokenizer::Tokenizer(&tokenizer,&filename);
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      __nbytes = 0;
      token.field_2._M_local_buf[0] = '\0';
      read_string._M_dataplus._M_p = (pointer)&read_string.field_2;
      read_string._M_string_length = 0;
      read_string.field_2._M_local_buf[0] = '\0';
      do {
        bVar1 = std::operator!=(&token,"EOF");
        if (!bVar1) {
          iVar2 = 0;
          if (local_d48._M_cur != (__node_type *)0x0) {
            Parser::printAST(&parser);
          }
          goto LAB_0012f3f7;
        }
        bVar1 = Tokenizer::getNextToken(&tokenizer,&token,&read_string);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur != (__node_type *)0x0 ||
            iVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          poVar8 = std::operator<<((ostream *)&std::cout,(string *)&token);
          poVar8 = std::operator<<(poVar8," [");
          poVar8 = std::operator<<(poVar8,(string *)&read_string);
          poVar8 = std::operator<<(poVar8,"]");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        if (!bVar1) break;
        sVar9 = Parser::read(&parser,(int)&token,&read_string,__nbytes);
      } while ((char)sVar9 != '\0');
      iVar2 = Tokenizer::getCurrentLine(&tokenizer);
      std::__cxx11::to_string(&line,iVar2 + 1);
      std::operator+(&local_5f0,"An error occurred on line ",&line);
      std::operator+(&local_570,&local_5f0," when parsing [");
      std::operator+(&local_4f0,&local_570,&read_string);
      std::operator+(&local_470,&local_4f0,"]");
      printError(&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&line);
      iVar2 = 1;
LAB_0012f3f7:
      std::__cxx11::string::~string((string *)&read_string);
      std::__cxx11::string::~string((string *)&token);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokenizer.lines_);
      Parser::~Parser(&parser);
      std::
      vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
      ::~vector(&table);
      ParseTableCalculation::~ParseTableCalculation(&table_calculation);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&rules);
      std::__cxx11::string::~string((string *)&filename);
    }
  }
  else {
    iVar2 = 0;
    printHelp();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&args._M_h);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
	auto args = parseArguments("filename", argc, argv);

	if (args.find("help") != args.end())
	{
		printHelp();
		return 0;
	}

	auto it_filename = args.find("filename");
	if (it_filename == args.end())
	{
		std::cout << std::endl;
		printError("No file provided");
		printHelp();
		return -1;
	}

	bool print_tokenizer_debug = args.find("tokenizer_debug") != args.end();
	bool print_table_calculation_debug = args.find("table_debug") != args.end();
	bool print_parser_debug = args.find("parser_debug") != args.end();
	if (args.find("debug") != args.end())
	{
		print_tokenizer_debug = true;
		print_table_calculation_debug = true;
		print_parser_debug = true;
	}
	bool print_ast = args.find("ast") != args.end();
	std::string filename = it_filename->second;

	std::vector<std::vector<std::string>> rules = {
		{"program", "commands", "EOF"},
		{"commands", "command", "SEMICOLON", "commands"},
		{"commands", "block", "commands"},
		{"commands", ""},
		{"command", "PRINT", "rvalue"},
		{"command", "VARIABLE", "ASSIGN", "rvalue"},
		{"command", "function_call"},
		{"command", "return"},
		{"block", "OPEN_CURLY_BRACKET", "commands", "CLOSE_CURLY_BRACKET"},
		{"function", "FUNCTION", "parameter_list", "block"},
		{"parameter_list", "OPEN_BRACKET", "parameters", "CLOSE_BRACKET"},
		{"parameter_list", "OPEN_BRACKET", "CLOSE_BRACKET"},
		{"parameters", "parameter", "COMMA", "parameters"},
		{"parameters", "parameter"},
		{"parameter", "VARIABLE"},
		{"function_call", "VARIABLE", "parameter_list"},
		{"return", "RETURN", "rvalue"},
		{"rvalue", "rvalue", "SUB", "rvalue"},
		{"rvalue", "rvalue", "ADD", "rvalue"},
		{"rvalue", "rvalue", "MUL", "rvalue"},
		{"rvalue", "rvalue", "DIV", "rvalue"},
		{"rvalue", "OPEN_BRACKET", "rvalue", "CLOSE_BRACKET"},
		{"rvalue", "STRING"},
		{"rvalue", "NUMBER"},
		{"rvalue", "VARIABLE"},
		{"rvalue", "function"}

	};
	ParseTableCalculation table_calculation(rules, print_table_calculation_debug);
	auto table = table_calculation.calculateTable();
	Parser parser(rules, table, print_parser_debug);

	Tokenizer tokenizer(filename);
	std::string token, read_string;
	while (token != "EOF")
	{
		bool success = tokenizer.getNextToken(token, read_string);
		if (print_tokenizer_debug)
		{
			std::cout << token << " [" << read_string << "]" << std::endl;
		}
		if (success)
		{
			success = parser.read(token, read_string);
		}
		if (!success)
		{
			std::string line = std::to_string(tokenizer.getCurrentLine() + 1);
			printError("An error occurred on line " + line + " when parsing [" + read_string + "]");
			return 1;
		}
	}
	if (print_ast)
	{
		parser.printAST();
	}
	return 0;
}